

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iso_writer.cpp
# Opt level: O1

void anon_unknown.dwarf_1264d9::writeDString(uint8_t *buffer,char *value,size_t fieldLen)

{
  ulong uVar1;
  byte bVar2;
  byte bVar3;
  char cVar4;
  ushort uVar5;
  convertUTF cVar6;
  undefined2 uVar7;
  pointer puVar8;
  char cVar9;
  uchar uVar10;
  int iVar11;
  byte *pbVar12;
  int iVar13;
  uint uVar14;
  long lVar15;
  vector<unsigned_char,_std::allocator<unsigned_char>_> content;
  undefined2 local_8e;
  undefined2 local_8c;
  uchar local_89;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_88;
  allocator<char> local_61;
  byte *local_60;
  long local_58;
  long local_50 [2];
  size_t local_40;
  uint8_t *local_38;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,value,&local_61);
  local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (uchar *)0x0;
  local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (uchar *)0x0;
  local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (uchar *)0x0;
  if (local_58 == 0) goto LAB_0018f124;
  local_38 = buffer;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::reserve(&local_88,fieldLen);
  uVar1 = fieldLen - 1;
  local_40 = fieldLen;
  if (local_58 == 0) {
LAB_0018eeb0:
    local_8e = CONCAT11(local_8e._1_1_,8);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
              (&local_88,(uchar *)&local_8e);
    pbVar12 = local_60;
    do {
      if (pbVar12 == local_60 + local_58) break;
      cVar4 = convertUTF::trailingBytesForUTF8[*pbVar12];
      switch(cVar4) {
      case '\0':
        cVar9 = cVar4;
        break;
      case '\x05':
        pbVar12 = pbVar12 + 1;
      case '\x04':
        pbVar12 = pbVar12 + 1;
      case '\x03':
        pbVar12 = pbVar12 + 1;
      case '\x02':
        pbVar12 = pbVar12 + 1;
      case '\x01':
        bVar2 = *pbVar12;
        pbVar12 = pbVar12 + 1;
        cVar9 = bVar2 << 6;
        break;
      default:
        cVar9 = '\0';
        goto LAB_0018ef2c;
      }
      bVar2 = *pbVar12;
      pbVar12 = pbVar12 + 1;
      cVar9 = bVar2 + cVar9;
LAB_0018ef2c:
      uVar10 = cVar9 - (char)*(undefined4 *)
                              (convertUTF::offsetsFromUTF8 + (ulong)(ushort)(short)cVar4 * 4);
      local_8e = CONCAT11(local_8e._1_1_,uVar10);
      if (local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_char,std::allocator<unsigned_char>>::
        _M_realloc_insert<unsigned_char_const&>
                  ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_88,
                   (iterator)
                   local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_finish,(uchar *)&local_8e);
      }
      else {
        *local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_finish = uVar10;
        local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
      }
    } while ((ulong)((long)local_88.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_finish -
                    (long)local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start) < uVar1);
  }
  else {
    pbVar12 = local_60;
    do {
      bVar2 = *pbVar12;
      bVar3 = convertUTF::trailingBytesForUTF8[bVar2];
      iVar13 = 0;
      iVar11 = 0;
      switch(bVar3) {
      case 0:
        uVar14 = (uint)bVar3;
        break;
      case 5:
        pbVar12 = pbVar12 + 1;
        iVar11 = (uint)bVar2 << 6;
      case 4:
        bVar2 = *pbVar12;
        pbVar12 = pbVar12 + 1;
        iVar13 = ((uint)bVar2 + iVar11) * 0x40;
      case 3:
        bVar2 = *pbVar12;
        pbVar12 = pbVar12 + 1;
        iVar13 = ((uint)bVar2 + iVar13) * 0x40;
      case 2:
        bVar2 = *pbVar12;
        pbVar12 = pbVar12 + 1;
        iVar13 = ((uint)bVar2 + iVar13) * 0x40;
      case 1:
        bVar2 = *pbVar12;
        pbVar12 = pbVar12 + 1;
        uVar14 = ((uint)bVar2 + iVar13) * 0x40;
        break;
      default:
        goto switchD_0018ee2c_default;
      }
      bVar2 = *pbVar12;
      pbVar12 = pbVar12 + 1;
      iVar13 = bVar2 + uVar14;
switchD_0018ee2c_default:
    } while (((uint)(iVar13 - *(int *)(convertUTF::offsetsFromUTF8 +
                                      (ulong)(ushort)(short)(char)bVar3 * 4)) < 0x100) &&
            (pbVar12 != local_60 + local_58));
    if ((uint)(iVar13 - *(int *)(convertUTF::offsetsFromUTF8 + (ulong)(ushort)(short)(char)bVar3 * 4
                                )) < 0x100) goto LAB_0018eeb0;
    local_8e = CONCAT11(local_8e._1_1_,0x10);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
              (&local_88,(uchar *)&local_8e);
    if (local_58 != 0) {
      pbVar12 = local_60;
      do {
        bVar2 = *pbVar12;
        bVar3 = convertUTF::trailingBytesForUTF8[bVar2];
        iVar11 = 0;
        iVar13 = 0;
        switch(bVar3) {
        case 0:
          uVar14 = (uint)bVar3;
          break;
        case 5:
          pbVar12 = pbVar12 + 1;
          iVar13 = (uint)bVar2 << 6;
        case 4:
          bVar2 = *pbVar12;
          pbVar12 = pbVar12 + 1;
          iVar11 = ((uint)bVar2 + iVar13) * 0x40;
        case 3:
          bVar2 = *pbVar12;
          pbVar12 = pbVar12 + 1;
          iVar11 = ((uint)bVar2 + iVar11) * 0x40;
        case 2:
          bVar2 = *pbVar12;
          pbVar12 = pbVar12 + 1;
          iVar11 = ((uint)bVar2 + iVar11) * 0x40;
        case 1:
          bVar2 = *pbVar12;
          pbVar12 = pbVar12 + 1;
          uVar14 = ((uint)bVar2 + iVar11) * 0x40;
          break;
        default:
          goto switchD_0018efc6_default;
        }
        bVar2 = *pbVar12;
        pbVar12 = pbVar12 + 1;
        iVar11 = bVar2 + uVar14;
switchD_0018efc6_default:
        convertUTF::ConvertUTF32toUTF16
                  ((convertUTF *)&local_8e,
                   iVar11 - *(int *)(convertUTF::offsetsFromUTF8 +
                                    (ulong)(ushort)(short)(char)bVar3 * 4));
        uVar7 = local_8c;
        uVar5 = local_8e;
        if ((local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start +
             (uVar1 - (long)local_88.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_finish) < (uchar *)0x2) ||
           ((local_8e != 0 &&
            (local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start +
             (uVar1 - (long)local_88.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_finish) < (uchar *)0x4)))) break;
        cVar6 = local_8e._1_1_;
        local_8e._0_1_ = SUB21((ushort)local_8c >> 8,0);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                  (&local_88,(uchar *)&local_8e);
        local_8e = CONCAT11(local_8e._1_1_,(char)uVar7);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                  (&local_88,(uchar *)&local_8e);
        if (uVar5 != 0) {
          local_8e._0_1_ = cVar6;
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                    (&local_88,(uchar *)&local_8e);
          local_8e = CONCAT11(local_8e._1_1_,(char)uVar5);
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                    (&local_88,(uchar *)&local_8e);
        }
      } while (pbVar12 != local_60 + local_58);
    }
  }
  local_89 = (uchar)((long)local_88.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_finish -
                    (long)local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  lVar15 = uVar1 - ((long)local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_start);
  if (lVar15 != 0) {
    do {
      local_8e = local_8e & 0xff00;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                (&local_88,(uchar *)&local_8e);
      lVar15 = lVar15 + -1;
    } while (lVar15 != 0);
  }
  if (local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_char,std::allocator<unsigned_char>>::
    _M_realloc_insert<unsigned_char_const&>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_88,
               (iterator)
               local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish,&local_89);
    buffer = local_38;
    fieldLen = local_40;
  }
  else {
    *local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
     super__Vector_impl_data._M_finish = local_89;
    local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_finish + 1;
    buffer = local_38;
    fieldLen = local_40;
  }
LAB_0018f124:
  if (local_60 != (byte *)local_50) {
    operator_delete(local_60,local_50[0] + 1);
  }
  puVar8 = local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((long)local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start != fieldLen) {
    __assert_fail("content.size() == fieldLen",
                  "/workspace/llm4binary/github/license_c_cmakelists/justdan96[P]tsMuxer/tsMuxer/iso_writer.cpp"
                  ,0xb6,
                  "void (anonymous namespace)::writeDString(uint8_t *, const char *, const size_t)")
    ;
  }
  if (local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start) {
    memmove(buffer,local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start,
            (long)local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  .super__Vector_impl_data._M_finish -
            (long)local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  .super__Vector_impl_data._M_start);
  }
  if (puVar8 != (uchar *)0x0) {
    operator_delete(puVar8,(long)local_88.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar8);
  }
  return;
}

Assistant:

void writeDString(uint8_t *buffer, const char *value, const size_t fieldLen)
{
    auto content = serializeDString(value, fieldLen);
    assert(content.size() == fieldLen);
    std::copy(std::begin(content), std::end(content), buffer);
}